

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_insertAndFindFirstIndexHash3(ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  int in_EDX;
  uint *in_RSI;
  long in_RDI;
  size_t hash3;
  U32 target;
  U32 idx;
  BYTE *base;
  U32 hashLog3;
  U32 *hashTable3;
  U32 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar6;
  uint local_34;
  
  lVar2 = *(long *)(in_RDI + 0x78);
  iVar1 = *(int *)(in_RDI + 0x30);
  local_34 = *in_RSI;
  uVar3 = in_EDX - (int)*(undefined8 *)(in_RDI + 8);
  sVar4 = ZSTD_hash3Ptr((void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
  if (iVar1 == 0) {
    __assert_fail("hashLog3 > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x80c3,
                  "U32 ZSTD_insertAndFindFirstIndexHash3(const ZSTD_matchState_t *, U32 *, const BYTE *const)"
                 );
  }
  for (; local_34 < uVar3; local_34 = local_34 + 1) {
    uVar6 = local_34;
    sVar5 = ZSTD_hash3Ptr((void *)CONCAT44(local_34,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
    *(uint *)(lVar2 + sVar5 * 4) = uVar6;
  }
  *in_RSI = uVar3;
  return *(U32 *)(lVar2 + sVar4 * 4);
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndexHash3 (const ZSTD_matchState_t* ms,
                                              U32* nextToUpdate3,
                                              const BYTE* const ip)
{
    U32* const hashTable3 = ms->hashTable3;
    U32 const hashLog3 = ms->hashLog3;
    const BYTE* const base = ms->window.base;
    U32 idx = *nextToUpdate3;
    U32 const target = (U32)(ip - base);
    size_t const hash3 = ZSTD_hash3Ptr(ip, hashLog3);
    assert(hashLog3 > 0);

    while(idx < target) {
        hashTable3[ZSTD_hash3Ptr(base+idx, hashLog3)] = idx;
        idx++;
    }

    *nextToUpdate3 = target;
    return hashTable3[hash3];
}